

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

SASL_CHALLENGE_HANDLE sasl_challenge_create(amqp_binary challenge_value)

{
  int iVar1;
  SASL_CHALLENGE_HANDLE __ptr;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  amqp_binary value_00;
  
  value_00.bytes = challenge_value.bytes;
  __ptr = (SASL_CHALLENGE_HANDLE)malloc(8);
  if (__ptr != (SASL_CHALLENGE_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x42);
    __ptr->composite_value = value;
    if (value != (AMQP_VALUE)0x0) {
      value_00._8_8_ = challenge_value._8_8_ & 0xffffffff;
      item_value = amqpvalue_create_binary(value_00);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      amqpvalue_destroy(item_value);
      if (iVar1 == 0) {
        return __ptr;
      }
      amqpvalue_destroy(value);
    }
    free(__ptr);
  }
  return (SASL_CHALLENGE_HANDLE)0x0;
}

Assistant:

SASL_CHALLENGE_HANDLE sasl_challenge_create(amqp_binary challenge_value)
{
    SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)malloc(sizeof(SASL_CHALLENGE_INSTANCE));
    if (sasl_challenge_instance != NULL)
    {
        sasl_challenge_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(66);
        if (sasl_challenge_instance->composite_value == NULL)
        {
            free(sasl_challenge_instance);
            sasl_challenge_instance = NULL;
        }
        else
        {
            AMQP_VALUE challenge_amqp_value;
            int result = 0;

            challenge_amqp_value = amqpvalue_create_binary(challenge_value);
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_challenge_instance->composite_value, 0, challenge_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(challenge_amqp_value);
            if (result != 0)
            {
                sasl_challenge_destroy(sasl_challenge_instance);
                sasl_challenge_instance = NULL;
            }
        }
    }

    return sasl_challenge_instance;
}